

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

bool __thiscall
ImPlot::LineSegmentsRenderer<ImPlot::GetterYs<float>,_ImPlot::GetterYRef,_ImPlot::TransformerLinLog>
::operator()(LineSegmentsRenderer<ImPlot::GetterYs<float>,_ImPlot::GetterYRef,_ImPlot::TransformerLinLog>
             *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  float *pfVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  ImVec2 IVar5;
  int iVar6;
  ImU32 IVar7;
  uint uVar8;
  GetterYs<float> *pGVar9;
  TransformerLinLog *pTVar10;
  ImPlotPlot *pIVar11;
  GetterYRef *pGVar12;
  ImDrawVert *pIVar13;
  ImDrawIdx *pIVar14;
  ImPlotContext *pIVar15;
  ImPlotContext *pIVar16;
  ImDrawIdx IVar17;
  bool bVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  double dVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  
  pIVar15 = GImPlot;
  pGVar9 = this->Getter1;
  pTVar10 = this->Transformer;
  dVar2 = pGVar9->XScale;
  dVar3 = pGVar9->X0;
  iVar6 = pGVar9->Count;
  dVar22 = log10((double)*(float *)((long)pGVar9->Ys +
                                   (long)(((prim + pGVar9->Offset) % iVar6 + iVar6) % iVar6) *
                                   (long)pGVar9->Stride) /
                 GImPlot->CurrentPlot->YAxis[pTVar10->YAxis].Range.Min);
  pIVar16 = GImPlot;
  iVar6 = pTVar10->YAxis;
  pIVar11 = pIVar15->CurrentPlot;
  dVar4 = pIVar11->YAxis[iVar6].Range.Min;
  fVar23 = (float)(((dVar2 * (double)prim + dVar3) - (pIVar11->XAxis).Range.Min) * pIVar15->Mx +
                  (double)pIVar15->PixelRange[iVar6].Min.x);
  fVar19 = (float)((((double)(float)(dVar22 / pIVar15->LogDenY[iVar6]) *
                     (pIVar11->YAxis[iVar6].Range.Max - dVar4) + dVar4) - dVar4) *
                   pIVar15->My[iVar6] + (double)pIVar15->PixelRange[iVar6].Min.y);
  pGVar12 = this->Getter2;
  dVar2 = pGVar12->XScale;
  dVar3 = pGVar12->X0;
  pTVar10 = this->Transformer;
  dVar22 = log10(pGVar12->YRef / GImPlot->CurrentPlot->YAxis[pTVar10->YAxis].Range.Min);
  iVar6 = pTVar10->YAxis;
  pIVar11 = pIVar16->CurrentPlot;
  dVar4 = pIVar11->YAxis[iVar6].Range.Min;
  fVar24 = (float)((((double)prim * dVar2 + dVar3) - (pIVar11->XAxis).Range.Min) * pIVar16->Mx +
                  (double)pIVar16->PixelRange[iVar6].Min.x);
  fVar25 = (float)((((double)(float)(dVar22 / pIVar16->LogDenY[iVar6]) *
                     (pIVar11->YAxis[iVar6].Range.Max - dVar4) + dVar4) - dVar4) *
                   pIVar16->My[iVar6] + (double)pIVar16->PixelRange[iVar6].Min.y);
  fVar20 = fVar19;
  if (fVar25 <= fVar19) {
    fVar20 = fVar25;
  }
  bVar18 = false;
  if ((fVar20 < (cull_rect->Max).y) &&
     (fVar20 = (float)(~-(uint)(fVar25 <= fVar19) & (uint)fVar25 |
                      -(uint)(fVar25 <= fVar19) & (uint)fVar19), pfVar1 = &(cull_rect->Min).y,
     *pfVar1 <= fVar20 && fVar20 != *pfVar1)) {
    fVar20 = fVar23;
    if (fVar24 <= fVar23) {
      fVar20 = fVar24;
    }
    bVar18 = false;
    if (fVar20 < (cull_rect->Max).x) {
      fVar20 = (float)(~-(uint)(fVar24 <= fVar23) & (uint)fVar24 |
                      -(uint)(fVar24 <= fVar23) & (uint)fVar23);
      bVar18 = (cull_rect->Min).x <= fVar20 && fVar20 != (cull_rect->Min).x;
    }
  }
  if (bVar18 != false) {
    fVar20 = this->Weight;
    IVar7 = this->Col;
    IVar5 = *uv;
    fVar26 = fVar24 - fVar23;
    fVar27 = fVar25 - fVar19;
    fVar21 = fVar26 * fVar26 + fVar27 * fVar27;
    if (0.0 < fVar21) {
      if (fVar21 < 0.0) {
        fVar21 = sqrtf(fVar21);
      }
      else {
        fVar21 = SQRT(fVar21);
      }
      fVar26 = fVar26 * (1.0 / fVar21);
      fVar27 = fVar27 * (1.0 / fVar21);
    }
    fVar20 = fVar20 * 0.5;
    fVar26 = fVar26 * fVar20;
    fVar20 = fVar20 * fVar27;
    pIVar13 = DrawList->_VtxWritePtr;
    (pIVar13->pos).x = fVar20 + fVar23;
    (pIVar13->pos).y = fVar19 - fVar26;
    pIVar13->uv = IVar5;
    pIVar13 = DrawList->_VtxWritePtr;
    pIVar13->col = IVar7;
    pIVar13[1].pos.x = fVar20 + fVar24;
    pIVar13[1].pos.y = fVar25 - fVar26;
    pIVar13[1].uv = IVar5;
    pIVar13 = DrawList->_VtxWritePtr;
    pIVar13[1].col = IVar7;
    pIVar13[2].pos.x = fVar24 - fVar20;
    pIVar13[2].pos.y = fVar26 + fVar25;
    pIVar13[2].uv = IVar5;
    pIVar13 = DrawList->_VtxWritePtr;
    pIVar13[2].col = IVar7;
    pIVar13[3].pos.x = fVar23 - fVar20;
    pIVar13[3].pos.y = fVar26 + fVar19;
    pIVar13[3].uv = IVar5;
    pIVar13 = DrawList->_VtxWritePtr;
    pIVar13[3].col = IVar7;
    DrawList->_VtxWritePtr = pIVar13 + 4;
    uVar8 = DrawList->_VtxCurrentIdx;
    pIVar14 = DrawList->_IdxWritePtr;
    IVar17 = (ImDrawIdx)uVar8;
    *pIVar14 = IVar17;
    pIVar14[1] = IVar17 + 1;
    pIVar14[2] = IVar17 + 2;
    pIVar14[3] = IVar17;
    pIVar14[4] = IVar17 + 2;
    pIVar14[5] = IVar17 + 3;
    DrawList->_IdxWritePtr = pIVar14 + 6;
    DrawList->_VtxCurrentIdx = uVar8 + 4;
  }
  return bVar18;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P1 = Transformer(Getter1(prim));
        ImVec2 P2 = Transformer(Getter2(prim));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2))))
            return false;
        AddLine(P1,P2,Weight,Col,DrawList,uv);
        return true;
    }